

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

bool __thiscall QGles2GraphicsPipeline::create(QGles2GraphicsPipeline *this)

{
  Type TVar1;
  QRhiGles2 *this_00;
  void *pvVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  GLuint GVar7;
  ProgramCacheResult PVar8;
  uint *puVar9;
  ulong uVar10;
  iterator ub_00;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  iterator mapping;
  iterator iVar14;
  uint *puVar15;
  GLchar *pGVar16;
  char *pcVar17;
  UniformBlock *ub;
  QRhiGles2 *this_01;
  QRhiShaderStage *shaderStage;
  QRhiShaderStage *pQVar18;
  long lVar19;
  bool bVar20;
  InOutVariable *inVar;
  long lVar21;
  long in_FS_OFFSET;
  QRhiShaderStage *shaderStage_1;
  QShader shader;
  QArrayDataPointer<char> local_598;
  QShaderVersion local_578;
  ActiveUniformLocationTracker activeUniformLocations;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  Blend local_c8;
  Blend BStack_b0;
  Blend local_98;
  Blend BStack_80;
  QShaderDescription local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QShaderDescription local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRhiGles2 *)(this->super_QRhiGraphicsPipeline).super_QRhiResource.m_rhi;
  if (this->program != 0) {
    (*(this->super_QRhiGraphicsPipeline).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  bVar20 = false;
  bVar5 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
  if (!bVar5) goto LAB_004e92ef;
  QElapsedTimer::start();
  bVar5 = QRhiImplementation::sanityCheckGraphicsPipeline
                    ((QRhiImplementation *)this_00,&this->super_QRhiGraphicsPipeline);
  if (!bVar5) {
    bVar20 = false;
    goto LAB_004e92ef;
  }
  this->drawMode =
       *(GLenum *)(&DAT_00605a88 + (long)(int)(this->super_QRhiGraphicsPipeline).m_topology * 4);
  GVar7 = (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x3f])();
  this->program = GVar7;
  local_48[0].d = (QShaderDescriptionPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (QShaderDescriptionPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  lVar21 = 0;
  do {
    QShaderDescription::QShaderDescription((QShaderDescription *)((long)&local_68.d + lVar21));
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0x28);
  local_98.opColor = 0;
  local_98.opAlpha = 0;
  BStack_80.srcColor = 0;
  BStack_80.dstColor = 0;
  local_98.srcColor = 0;
  local_98.dstColor = 0;
  local_98.srcAlpha = 0;
  local_98.dstAlpha = 0;
  BStack_b0.srcAlpha = 0;
  BStack_b0.dstAlpha = 0;
  BStack_b0.opColor = 0;
  BStack_b0.opAlpha = 0;
  local_c8.opColor = 0;
  local_c8.opAlpha = 0;
  BStack_b0.srcColor = 0;
  BStack_b0.dstColor = 0;
  local_c8.srcColor = 0;
  local_c8.dstColor = 0;
  local_c8.srcAlpha = 0;
  local_c8.dstAlpha = 0;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = 0;
  uStack_d0._0_4_ = 0;
  uStack_d0._4_4_ = 0;
  local_e8._0_4_ = 0;
  local_e8._4_4_ = 0;
  local_e8._8_4_ = 0;
  local_e8._12_4_ = 0;
  BStack_80.srcAlpha = 0;
  BStack_80.dstAlpha = 0;
  pQVar18 = (QRhiShaderStage *)
            (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
            super_QVLABaseBase.ptr;
  bVar5 = true;
  for (lVar21 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
                super_QVLABaseBase.s * 0x18; lVar21 != 0; lVar21 = lVar21 + -0x18) {
    TVar1 = pQVar18->m_type;
    uVar10 = (ulong)TVar1;
    if (uVar10 < 5) {
      shader.d = (QShaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QShader::QShader(&shader,&pQVar18->m_shader);
      local_578.m_version = 100;
      local_578.m_flags.super_QFlagsStorageHelper<QShaderVersion::Flag,_4>.
      super_QFlagsStorage<QShaderVersion::Flag>.i =
           (QFlagsStorageHelper<QShaderVersion::Flag,_4>)0x0;
      QShader::description((QShader *)&activeUniformLocations);
      QShaderDescription::operator=
                (&local_68 + uVar10,(QShaderDescription *)&activeUniformLocations);
      QShaderDescription::~QShaderDescription((QShaderDescription *)&activeUniformLocations);
      QRhiGles2::shaderSource((QByteArray *)&activeUniformLocations,this_00,pQVar18,&local_578);
      uVar4 = activeUniformLocations.buffer._16_8_;
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&activeUniformLocations);
      if (uVar4 != 0) {
        QShaderKey::QShaderKey
                  ((QShaderKey *)&local_598,GlslShader,&local_578,pQVar18->m_shaderVariant);
        QShader::separateToCombinedImageSamplerMappingList
                  ((SeparateToCombinedImageSamplerMappingList *)&activeUniformLocations,&shader,
                   (QShaderKey *)&local_598);
        QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::operator=
                  ((QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)
                   (local_e8 + uVar10 * 0x18),
                   (QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)
                   &activeUniformLocations);
        QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::~QArrayDataPointer
                  ((QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)
                   &activeUniformLocations);
      }
      bVar5 = (bool)(bVar5 & (TVar1 & Geometry) == Vertex);
      QShader::~QShader(&shader);
    }
    pQVar18 = pQVar18 + 1;
  }
  local_598.size = 0;
  local_598.d = (Data *)0x0;
  local_598.ptr = (char *)0x0;
  pQVar18 = (QRhiShaderStage *)
            (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
            super_QVLABaseBase.ptr;
  qVar3 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
          super_QVLABaseBase.s;
  GVar7 = this->program;
  QShaderDescription::inputVariables
            ((QList<QShaderDescription::InOutVariable> *)&activeUniformLocations,&local_68);
  PVar8 = QRhiGles2::tryLoadFromDiskOrPipelineCache
                    (this_00,pQVar18,(int)qVar3,GVar7,
                     (QVector<QShaderDescription::InOutVariable> *)&activeUniformLocations,
                     (QByteArray *)&local_598);
  QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer
            ((QArrayDataPointer<QShaderDescription::InOutVariable> *)&activeUniformLocations);
  if (PVar8 == ProgramCacheMiss) {
    pQVar18 = (QRhiShaderStage *)
              (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
              super_QVLABaseBase.ptr;
    for (lVar21 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
                  super_QVLABaseBase.s * 0x18; lVar21 != 0; lVar21 = lVar21 + -0x18) {
      if (pQVar18->m_type < Compute) {
        bVar20 = false;
        bVar6 = QRhiGles2::compileShader(this_00,this->program,pQVar18,(QShaderVersion *)0x0);
        if (!bVar6) goto LAB_004e92ab;
      }
      pQVar18 = pQVar18 + 1;
    }
    QShaderDescription::inputVariables
              ((QList<QShaderDescription::InOutVariable> *)&activeUniformLocations,&local_68);
    iVar12 = QList<QShaderDescription::InOutVariable>::begin
                       ((QList<QShaderDescription::InOutVariable> *)&activeUniformLocations);
    iVar13 = QList<QShaderDescription::InOutVariable>::end
                       ((QList<QShaderDescription::InOutVariable> *)&activeUniformLocations);
    for (; iVar12.i != iVar13.i; iVar12.i = iVar12.i + 1) {
      pcVar17 = ((iVar12.i)->name).d.ptr;
      if (pcVar17 == (char *)0x0) {
        pcVar17 = (char *)&QByteArray::_empty;
      }
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x31])((ulong)this->program,(ulong)(uint)(iVar12.i)->location,pcVar17);
    }
    this_01 = (QRhiGles2 *)&activeUniformLocations;
    QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer
              ((QArrayDataPointer<QShaderDescription::InOutVariable> *)this_01);
    if (bVar5) {
      QRhiGles2::sanityCheckVertexFragmentInterface(this_01,&local_68,local_48);
    }
    bVar5 = QRhiGles2::linkProgram(this_00,this->program);
    if (!bVar5) goto LAB_004e91b7;
    if (((this_00->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.
         super_QFlagsStorage<QRhi::Flag>.i & 4) != 0) {
      QRhiGles2::trySaveToPipelineCache(this_00,this->program,(QByteArray *)&local_598,true);
    }
    QRhiGles2::trySaveToDiskCache(this_00,this->program,(QByteArray *)&local_598);
LAB_004e904c:
    memcpy(&activeUniformLocations,&DAT_00605490,0x488);
    QDuplicateTracker<int,_32UL>::QDuplicateTracker(&activeUniformLocations);
    puVar9 = (uint *)(this->super_QRhiGraphicsPipeline).m_shaderStages.
                     super_QVLABase<QRhiShaderStage>.super_QVLABaseBase.ptr;
    puVar15 = puVar9 + (this->super_QRhiGraphicsPipeline).m_shaderStages.
                       super_QVLABase<QRhiShaderStage>.super_QVLABaseBase.s * 6;
    for (; puVar9 != puVar15; puVar9 = puVar9 + 6) {
      uVar10 = (ulong)*puVar9;
      if (uVar10 < 5) {
        QShaderDescription::uniformBlocks
                  ((QList<QShaderDescription::UniformBlock> *)&shader,&local_68 + uVar10);
        ub_00 = QList<QShaderDescription::UniformBlock>::begin
                          ((QList<QShaderDescription::UniformBlock> *)&shader);
        iVar11 = QList<QShaderDescription::UniformBlock>::end
                           ((QList<QShaderDescription::UniformBlock> *)&shader);
        for (; ub_00.i != iVar11.i; ub_00.i = ub_00.i + 1) {
          QRhiGles2::gatherUniforms
                    (this_00,this->program,ub_00.i,&activeUniformLocations,&this->uniforms);
        }
        QArrayDataPointer<QShaderDescription::UniformBlock>::~QArrayDataPointer
                  ((QArrayDataPointer<QShaderDescription::UniformBlock> *)&shader);
        QShaderDescription::combinedImageSamplers
                  ((QList<QShaderDescription::InOutVariable> *)&shader,&local_68 + uVar10);
        iVar12 = QList<QShaderDescription::InOutVariable>::begin
                           ((QList<QShaderDescription::InOutVariable> *)&shader);
        iVar13 = QList<QShaderDescription::InOutVariable>::end
                           ((QList<QShaderDescription::InOutVariable> *)&shader);
        for (; iVar12.i != iVar13.i; iVar12.i = iVar12.i + 1) {
          QRhiGles2::gatherSamplers(this_00,this->program,iVar12.i,&this->samplers);
        }
        QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer
                  ((QArrayDataPointer<QShaderDescription::InOutVariable> *)&shader);
        mapping = QList<QShader::SeparateToCombinedImageSamplerMapping>::begin
                            ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                             (local_e8 + uVar10 * 0x18));
        iVar14 = QList<QShader::SeparateToCombinedImageSamplerMapping>::end
                           ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                            (local_e8 + uVar10 * 0x18));
        for (; mapping.i != iVar14.i; mapping.i = mapping.i + 1) {
          QRhiGles2::gatherGeneratedSamplers(this_00,this->program,mapping.i,&this->samplers);
        }
      }
    }
    uVar10 = (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.s;
    if (uVar10 != 0) {
      pvVar2 = (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.ptr;
      lVar21 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      std::
      __introsort_loop<QGles2UniformDescription*,long,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                (pvVar2,(void *)((long)pvVar2 + uVar10 * 0x18),((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar10 < 0x11) {
        std::
        __insertion_sort<QGles2UniformDescription*,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                  (pvVar2);
      }
      else {
        lVar21 = (long)pvVar2 + 0x180;
        std::
        __insertion_sort<QGles2UniformDescription*,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                  (pvVar2);
        for (lVar19 = uVar10 * 0x18 + -0x180; lVar19 != 0; lVar19 = lVar19 + -0x18) {
          std::
          __unguarded_linear_insert<QGles2UniformDescription*,__gnu_cxx::__ops::_Val_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                    (lVar21);
          lVar21 = lVar21 + 0x18;
        }
      }
    }
    memset(this->uniformState,0,0x5000);
    this->currentSrb = (QRhiShaderResourceBindings *)0x0;
    this->currentSrbGeneration = 0;
    if (this_00->glObjectLabel != (_func_void_GLenum_GLuint_GLsizei_GLchar_ptr *)0x0) {
      pGVar16 = (this->super_QRhiGraphicsPipeline).super_QRhiResource.m_objectName.d.ptr;
      if (pGVar16 == (GLchar *)0x0) {
        pGVar16 = (GLchar *)&QByteArray::_empty;
      }
      (*this_00->glObjectLabel)(0x82e2,this->program,-1,pGVar16);
    }
    QRhiImplementation::pipelineCreationEnd((QRhiImplementation *)this_00);
    this->generation = this->generation + 1;
    QRhiImplementation::registerResource((QRhiImplementation *)this_00,(QRhiResource *)this,true);
    QDuplicateTracker<int,_32UL>::~QDuplicateTracker(&activeUniformLocations);
    bVar20 = true;
  }
  else {
    if (PVar8 != ProgramCacheError) {
      if (((this_00->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.
           super_QFlagsStorage<QRhi::Flag>.i & 4) != 0) {
        QRhiGles2::trySaveToPipelineCache(this_00,this->program,(QByteArray *)&local_598,false);
      }
      goto LAB_004e904c;
    }
LAB_004e91b7:
    bVar20 = false;
  }
LAB_004e92ab:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_598);
  lVar21 = 0x60;
  do {
    QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::~QArrayDataPointer
              ((QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)
               (local_e8 + lVar21));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  lVar21 = 0x20;
  do {
    QShaderDescription::~QShaderDescription((QShaderDescription *)((long)&local_68.d + lVar21));
    lVar21 = lVar21 + -8;
  } while (lVar21 != -8);
LAB_004e92ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar20;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2GraphicsPipeline::create()
{
    QRHI_RES_RHI(QRhiGles2);

    if (program)
        destroy();

    if (!rhiD->ensureContext())
        return false;

    rhiD->pipelineCreationStart();
    if (!rhiD->sanityCheckGraphicsPipeline(this))
        return false;

    drawMode = toGlTopology(m_topology);

    program = rhiD->f->glCreateProgram();

    enum {
        VtxIdx = 0,
        TCIdx,
        TEIdx,
        GeomIdx,
        FragIdx,
        LastIdx
    };
    const auto descIdxForStage = [](const QRhiShaderStage &shaderStage) {
        switch (shaderStage.type()) {
        case QRhiShaderStage::Vertex:
            return VtxIdx;
        case QRhiShaderStage::TessellationControl:
            return TCIdx;
        case QRhiShaderStage::TessellationEvaluation:
            return TEIdx;
        case QRhiShaderStage::Geometry:
            return GeomIdx;
        case QRhiShaderStage::Fragment:
            return FragIdx;
        default:
            break;
        }
        Q_UNREACHABLE_RETURN(VtxIdx);
    };
    QShaderDescription desc[LastIdx];
    QShader::SeparateToCombinedImageSamplerMappingList samplerMappingList[LastIdx];
    bool vertexFragmentOnly = true;
    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            if (idx != VtxIdx && idx != FragIdx)
                vertexFragmentOnly = false;
            QShader shader = shaderStage.shader();
            QShaderVersion shaderVersion;
            desc[idx] = shader.description();
            if (!rhiD->shaderSource(shaderStage, &shaderVersion).isEmpty()) {
                samplerMappingList[idx] = shader.separateToCombinedImageSamplerMappingList(
                            { QShader::GlslShader, shaderVersion, shaderStage.shaderVariant() });
            }
        }
    }

    QByteArray cacheKey;
    QRhiGles2::ProgramCacheResult cacheResult = rhiD->tryLoadFromDiskOrPipelineCache(m_shaderStages.constData(),
                                                                                     m_shaderStages.size(),
                                                                                     program,
                                                                                     desc[VtxIdx].inputVariables(),
                                                                                     &cacheKey);
    if (cacheResult == QRhiGles2::ProgramCacheError)
        return false;

    if (cacheResult == QRhiGles2::ProgramCacheMiss) {
        for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
            if (isGraphicsStage(shaderStage)) {
                if (!rhiD->compileShader(program, shaderStage, nullptr))
                    return false;
            }
        }

        // important when GLSL <= 150 is used that does not have location qualifiers
        for (const QShaderDescription::InOutVariable &inVar : desc[VtxIdx].inputVariables())
            rhiD->f->glBindAttribLocation(program, GLuint(inVar.location), inVar.name);

        if (vertexFragmentOnly)
            rhiD->sanityCheckVertexFragmentInterface(desc[VtxIdx], desc[FragIdx]);

        if (!rhiD->linkProgram(program))
            return false;

        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // force replacing existing cache entry (if there is one, then
            // something is wrong with it, as there was no hit)
            rhiD->trySaveToPipelineCache(program, cacheKey, true);
        }
        // legacy QOpenGLShaderProgram style behavior: do this always, even
        // though it is superfluous with the "pipeline cache" enabled. Continue
        // storing to the Qt 5 style individual-file disk cache, because there
        // is no guarantee one retrieves the "pipeline cache" blob and writes it
        // out. Classic example: if Qt Quick only retrieves and stores the
        // combined cache contents when exiting, applications that never exit
        // cleanly (because they are killed, Ctrl+C'd, etc.) never store any
        // program binaries! Therefore, to maintain Qt 5 behavioral
        // compatibility, continue writing out the individual files no matter
        // what.
        rhiD->trySaveToDiskCache(program, cacheKey);
    } else {
        Q_ASSERT(cacheResult == QRhiGles2::ProgramCacheHit);
        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // just so that it ends up in the pipeline cache also when the hit was
            // from the disk cache
            rhiD->trySaveToPipelineCache(program, cacheKey);
        }
    }

    // Use the same work area for the vertex & fragment stages, thus ensuring
    // that we will not do superfluous glUniform calls for uniforms that are
    // present in both shaders.
    QRhiGles2::ActiveUniformLocationTracker activeUniformLocations;

    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            for (const QShaderDescription::UniformBlock &ub : desc[idx].uniformBlocks())
                rhiD->gatherUniforms(program, ub, &activeUniformLocations, &uniforms);
            for (const QShaderDescription::InOutVariable &v : desc[idx].combinedImageSamplers())
                rhiD->gatherSamplers(program, v, &samplers);
            for (const QShader::SeparateToCombinedImageSamplerMapping &mapping : samplerMappingList[idx])
                rhiD->gatherGeneratedSamplers(program, mapping, &samplers);
        }
    }

    std::sort(uniforms.begin(), uniforms.end(),
              [](const QGles2UniformDescription &a, const QGles2UniformDescription &b)
    {
        return a.offset < b.offset;
    });

    memset(uniformState, 0, sizeof(uniformState));

    currentSrb = nullptr;
    currentSrbGeneration = 0;

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_PROGRAM, program, -1, m_objectName.constData());

    rhiD->pipelineCreationEnd();
    generation += 1;
    rhiD->registerResource(this);
    return true;
}